

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> * __thiscall
clara::detail::Parser::getHelpColumns
          (vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<clara::detail::HelpColumns_*,_std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> childCols;
  Opt *o;
  const_iterator __end2;
  const_iterator __begin2;
  vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_> *__range2;
  Parser *this_local;
  vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> *cols;
  
  std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>::vector
            (__return_storage_ptr__);
  __end2 = std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::begin
                     (&this->m_options);
  o = (Opt *)std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::end
                       (&this->m_options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_clara::detail::Opt_*,_std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>_>
                                     *)&o), bVar1) {
    childCols.
    super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_clara::detail::Opt_*,_std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>_>
                  ::operator*(&__end2);
    Opt::getHelpColumns((vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
                         *)local_58,
                        (Opt *)childCols.
                               super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_78._M_current =
         (HelpColumns *)
         std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>::end
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<clara::detail::HelpColumns_const*,std::vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>>>
    ::__normal_iterator<clara::detail::HelpColumns*>
              ((__normal_iterator<clara::detail::HelpColumns_const*,std::vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>>>
                *)&local_70,&local_78);
    __first = std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>::
              begin((vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
                     *)local_58);
    __last = std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>::
             end((vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> *)
                 local_58);
    std::vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>>::
    insert<__gnu_cxx::__normal_iterator<clara::detail::HelpColumns*,std::vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>>>,void>
              ((vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>> *)
               __return_storage_ptr__,local_70,
               (__normal_iterator<clara::detail::HelpColumns_*,_std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>_>
                )__first._M_current,
               (__normal_iterator<clara::detail::HelpColumns_*,_std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>_>
                )__last._M_current);
    std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>::~vector
              ((vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> *)
               local_58);
    __gnu_cxx::
    __normal_iterator<const_clara::detail::Opt_*,_std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::vector<HelpColumns> cols;
            for (auto const &o : m_options) {
                auto childCols = o.getHelpColumns();
                cols.insert( cols.end(), childCols.begin(), childCols.end() );
            }
            return cols;
        }